

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::merkle_tree::blocks_verified(merkle_tree *this,int block_idx,int num_blocks)

{
  bool bVar1;
  int iVar2;
  int local_24;
  int i;
  int num_blocks_local;
  int block_idx_local;
  merkle_tree *this_local;
  
  switch(this->m_mode) {
  case uninitialized_tree:
    this_local._7_1_ = false;
    break;
  case empty_tree:
    this_local._7_1_ = this->m_num_blocks == 1;
    break;
  case full_tree:
    for (local_24 = block_idx; local_24 < block_idx + num_blocks; local_24 = local_24 + 1) {
      bVar1 = bitfield::get_bit(&this->m_block_verified,local_24);
      if (!bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
    break;
  case piece_layer:
    iVar2 = piece_levels(this);
    this_local._7_1_ = iVar2 == 0;
    break;
  case block_layer:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool merkle_tree::blocks_verified(int block_idx, int num_blocks) const
	{
		TORRENT_ASSERT(num_blocks > 0);
		TORRENT_ASSERT(block_idx < m_num_blocks);
		TORRENT_ASSERT(block_idx + num_blocks <= m_num_blocks);
		switch (m_mode)
		{
			case mode_t::uninitialized_tree:
				return false;
			case mode_t::empty_tree:
				return m_num_blocks == 1;
			case mode_t::piece_layer:
				return piece_levels() == 0;
			case mode_t::block_layer:
				return true;
			case mode_t::full_tree:
				for (int i = block_idx; i < block_idx + num_blocks; ++i)
					if (!m_block_verified.get_bit(i)) return false;
				return true;
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}